

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

int PyxmlNodeSet_Convert(PyObject *py_nodeset,xmlNodeSetPtr *result)

{
  xmlNodePtr pxVar1;
  uint uVar2;
  int iVar3;
  xmlNodeSetPtr pxVar4;
  xmlNodePtr *__s;
  ulong uVar5;
  PyTypeObject *pPVar6;
  char *pcVar7;
  undefined8 uVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar5 = py_nodeset->ob_type->tp_flags;
  uVar9 = (uint)uVar5;
  if ((uVar5 & 0x6000000) == 0) {
    if (py_nodeset == (PyObject *)&_Py_NoneStruct) {
      *result = (xmlNodeSetPtr)0x0;
      return 0;
    }
    pcVar7 = "must be a tuple or list of nodes.";
    uVar8 = _PyExc_TypeError;
  }
  else {
    pxVar4 = (xmlNodeSetPtr)(*_xmlMalloc)(0x10);
    if (pxVar4 != (xmlNodeSetPtr)0x0) {
      pxVar4->nodeNr = 0;
      uVar2 = (uint)py_nodeset->ob_type->tp_flags;
      if ((uVar9 >> 0x1a & 1) == 0) {
        if ((uVar2 >> 0x19 & 1) == 0) {
          __assert_fail("PyList_Check(py_nodeset)",
                        "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                        ,0xca0,"int PyxmlNodeSet_Convert(PyObject *, xmlNodeSetPtr *)");
        }
      }
      else if ((uVar2 >> 0x1a & 1) == 0) {
        __assert_fail("PyTuple_Check(py_nodeset)",
                      "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                      ,0xc9f,"int PyxmlNodeSet_Convert(PyObject *, xmlNodeSetPtr *)");
      }
      iVar3 = (int)py_nodeset[1].ob_refcnt;
      pxVar4->nodeMax = iVar3;
      __s = (xmlNodePtr *)(*_xmlMalloc)((long)iVar3 << 3);
      pxVar4->nodeTab = __s;
      if (__s != (xmlNodePtr *)0x0) {
        uVar10 = 0;
        memset(__s,0,(long)pxVar4->nodeMax << 3);
        uVar5 = (ulong)(uint)pxVar4->nodeMax;
        if (pxVar4->nodeMax < 1) {
          uVar5 = uVar10;
        }
        do {
          if (uVar5 == uVar10) {
            *result = pxVar4;
            return 0;
          }
          uVar2 = (uint)py_nodeset->ob_type->tp_flags;
          if ((uVar9 >> 0x1a & 1) == 0) {
            if ((uVar2 >> 0x19 & 1) == 0) {
              __assert_fail("PyList_Check(py_nodeset)",
                            "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                            ,0xcb2,"int PyxmlNodeSet_Convert(PyObject *, xmlNodeSetPtr *)");
            }
            pPVar6 = (PyTypeObject *)(&((py_nodeset[1].ob_type)->ob_base).ob_base.ob_refcnt)[uVar10]
            ;
          }
          else {
            if ((uVar2 >> 0x1a & 1) == 0) {
              __assert_fail("PyTuple_Check(py_nodeset)",
                            "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                            ,0xcb1,"int PyxmlNodeSet_Convert(PyObject *, xmlNodeSetPtr *)");
            }
            pPVar6 = (&py_nodeset[1].ob_type)[uVar10];
          }
          if ((pPVar6 != (PyTypeObject *)&_Py_NoneStruct) &&
             (pxVar1 = (xmlNodePtr)(pPVar6->ob_base).ob_size, pxVar1 != (xmlNodePtr)0x0)) {
            iVar3 = pxVar4->nodeNr;
            pxVar4->nodeNr = iVar3 + 1;
            pxVar4->nodeTab[iVar3] = pxVar1;
          }
          uVar10 = uVar10 + 1;
        } while( true );
      }
      (*_xmlFree)(pxVar4);
    }
    pcVar7 = "";
    uVar8 = _PyExc_MemoryError;
  }
  PyErr_SetString(uVar8,pcVar7);
  return -1;
}

Assistant:

static int
PyxmlNodeSet_Convert(PyObject *py_nodeset, xmlNodeSetPtr *result)
{
    xmlNodeSetPtr nodeSet;
    int is_tuple = 0;

    if (PyTuple_Check(py_nodeset))
        is_tuple = 1;
    else if (PyList_Check(py_nodeset))
        is_tuple = 0;
    else if (py_nodeset == Py_None) {
        *result = NULL;
        return 0;
    }
    else {
        PyErr_SetString(PyExc_TypeError,
                        "must be a tuple or list of nodes.");
        return -1;
    }

    nodeSet = (xmlNodeSetPtr) xmlMalloc(sizeof(xmlNodeSet));
    if (nodeSet == NULL) {
        PyErr_SetString(PyExc_MemoryError, "");
        return -1;
    }

    nodeSet->nodeNr = 0;
    nodeSet->nodeMax = (is_tuple
                        ? PyTuple_GET_SIZE(py_nodeset)
                        : PyList_GET_SIZE(py_nodeset));
    nodeSet->nodeTab
        = (xmlNodePtr *) xmlMalloc (nodeSet->nodeMax
                                    * sizeof(xmlNodePtr));
    if (nodeSet->nodeTab == NULL) {
        xmlFree(nodeSet);
        PyErr_SetString(PyExc_MemoryError, "");
        return -1;
    }
    memset(nodeSet->nodeTab, 0 ,
           nodeSet->nodeMax * sizeof(xmlNodePtr));

    {
        int idx;
        for (idx=0; idx < nodeSet->nodeMax; ++idx) {
            xmlNodePtr pynode =
                PyxmlNode_Get (is_tuple
                               ? PyTuple_GET_ITEM(py_nodeset, idx)
                               : PyList_GET_ITEM(py_nodeset, idx));
            if (pynode)
                nodeSet->nodeTab[nodeSet->nodeNr++] = pynode;
        }
    }
    *result = nodeSet;
    return 0;
}